

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

size_t bign96Start_keep(bign96_deep_i deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  code *in_RDI;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  size_t ec_deep;
  size_t ec_keep;
  size_t ec_d;
  size_t f_deep;
  size_t f_keep;
  size_t n;
  undefined8 local_58;
  
  sVar1 = gfpCreate_keep(0x1647ec);
  sVar2 = gfpCreate_deep(0x1647fb);
  sVar3 = ecpCreateJ_keep(3);
  sVar4 = ecpCreateJ_deep(in_stack_00000018,in_stack_00000010);
  sVar5 = ecCreateGroup_deep(sVar2);
  if (in_RDI == (code *)0x0) {
    local_58 = 0;
  }
  else {
    local_58 = (*in_RDI)(3,sVar2,3,sVar4);
  }
  sVar2 = utilMax(3,sVar4,sVar5,local_58);
  return sVar1 + sVar3 + sVar2;
}

Assistant:

size_t bign96Start_keep(bign96_deep_i deep)
{
	// размерности
	size_t n = W_OF_B(192);
	size_t f_keep = gfpCreate_keep(24);
	size_t f_deep = gfpCreate_deep(24);
	size_t ec_d = 3;
	size_t ec_keep = ecpCreateJ_keep(n);
	size_t ec_deep = ecpCreateJ_deep(n, f_deep);
	// расчет
	return f_keep + ec_keep +
		utilMax(3,
			ec_deep,
			ecCreateGroup_deep(f_deep),
			deep ? deep(n, f_deep, ec_d, ec_deep) : 0);
}